

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::_::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,StringTree *params_2,ArrayPtr<const_char> *params_3)

{
  size_t size;
  char *target;
  ArrayPtr<const_char> *first;
  ArrayPtr<const_char> *rest;
  StringTree *rest_1;
  ArrayPtr<const_char> *rest_2;
  size_type extraout_RDX;
  initializer_list<unsigned_long> nums;
  size_t local_68;
  size_t local_60;
  size_t local_58;
  size_t local_50;
  _ *local_48;
  undefined8 local_40;
  undefined1 local_31;
  StringTree *local_30;
  ArrayPtr<const_char> *params_local_3;
  StringTree *params_local_2;
  ArrayPtr<const_char> *params_local_1;
  ArrayPtr<const_char> *params_local;
  String *result;
  
  local_31 = 0;
  local_30 = params_2;
  params_local_3 = params_1;
  params_local_2 = (StringTree *)params;
  params_local_1 = (ArrayPtr<const_char> *)this;
  params_local = (ArrayPtr<const_char> *)__return_storage_ptr__;
  local_68 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)this);
  local_60 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_local_2);
  local_58 = StringTree::size((StringTree *)params_local_3);
  local_50 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)local_30);
  local_48 = (_ *)&local_68;
  local_40 = 4;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x4;
  size = sum(local_48,nums);
  heapString(__return_storage_ptr__,size);
  target = String::begin(__return_storage_ptr__);
  first = fwd<kj::ArrayPtr<char_const>>(params_local_1);
  rest = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_2);
  rest_1 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_3);
  rest_2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)local_30);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (target,first,rest,rest_1,rest_2);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}